

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

bool __thiscall
ON_SimpleArray<ON_SurfaceCurvature>::Permute(ON_SimpleArray<ON_SurfaceCurvature> *this,int *index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  void *__dest;
  long lVar5;
  long lVar6;
  
  if (this->m_a != (ON_SurfaceCurvature *)0x0) {
    if (index == (int *)0x0 || (long)this->m_count < 1) {
      bVar4 = false;
    }
    else {
      __dest = onmalloc((long)this->m_count << 4);
      memcpy(__dest,this->m_a,(long)this->m_count << 4);
      if (0 < this->m_count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          puVar1 = (undefined8 *)((long)__dest + (long)*(int *)((long)index + lVar5) * 0x10);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)&this->m_a->k1 + lVar5 * 4);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 4;
        } while (lVar6 < this->m_count);
      }
      onfree(__dest);
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::Permute( const int* index )
{
  bool rc = false;
  if ( m_a && m_count > 0 && index ) {
    int i;
    T* buffer = (T*)onmalloc(m_count*sizeof(buffer[0]));
    memcpy( (void*)(buffer), (void*)(m_a), m_count*sizeof(T) );
    for (i = 0; i < m_count; i++ )
      memcpy( (void*)(m_a+i), (void*)(buffer+index[i]), sizeof(T) ); // must use memcopy and not operator=
    onfree(buffer);
    rc = true;
  }
  return rc;
}